

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::CEExecOptions(CEExecOptions *this,string *prog_name)

{
  undefined8 *in_RDI;
  CLOptions *in_stack_00000040;
  string *in_stack_00000088;
  CEExecOptions *in_stack_00000090;
  
  CLOptions::CLOptions(in_stack_00000040);
  *in_RDI = &PTR__CEExecOptions_00136c10;
  std::__cxx11::string::string((string *)(in_RDI + 0x43));
  init_members((CEExecOptions *)0x124347);
  SetProgName(in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

CEExecOptions(const std::string& prog_name)
        {
            init_members();
            SetProgName(prog_name);
        }